

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PololuInterface.cpp
# Opt level: O1

void * PololuInterfaceThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  timespec local_40;
  
  if ((szPololuInterfacePath[0] == ':') && (iVar3 = atoi(szPololuInterfacePath + 1), 0 < iVar3)) {
    PololuInterfacePseudoRS232Port.DevType = 2;
    do {
      iVar3 = LaunchMultiCliTCPSrv(szPololuInterfacePath + 1,handlepololuinterfacecli,(void *)0x0);
      if (iVar3 == 0) break;
      puts("Error launching the PololuInterface server.");
      local_40.tv_sec = 4;
      local_40.tv_nsec = 0;
      nanosleep(&local_40,(timespec *)0x0);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    do {
      if (bVar1) {
        iVar3 = handlepololuinterface(&PololuInterfacePseudoRS232Port);
        if (iVar3 == 0) {
          bVar1 = true;
          bVar2 = false;
        }
        else {
          puts("Connection to a PololuInterface lost.");
          disconnectpololuinterface(&PololuInterfacePseudoRS232Port);
          local_40.tv_sec = 0;
          local_40.tv_nsec = 50000000;
LAB_00198084:
          bVar1 = false;
          nanosleep(&local_40,(timespec *)0x0);
          bVar2 = true;
        }
      }
      else {
        iVar3 = connectpololuinterface(&PololuInterfacePseudoRS232Port);
        if (iVar3 != 0) {
          local_40.tv_sec = 1;
          local_40.tv_nsec = 0;
          goto LAB_00198084;
        }
        local_40.tv_sec = 0;
        local_40.tv_nsec = 50000000;
        bVar2 = false;
        nanosleep(&local_40,(timespec *)0x0);
        bVar1 = true;
      }
    } while (bExit == 0);
    if (!bVar2) {
      disconnectpololuinterface(&PololuInterfacePseudoRS232Port);
    }
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE PololuInterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(pololuinterfacefilename, LOG_FOLDER"pololuinterface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//pololuinterfacefile = fopen(pololuinterfacefilename, "w");
	//if (pololuinterfacefile == NULL)
	//{
	//	printf("Unable to create pololuinterface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szPololuInterfacePath[0] == ':')&&(atoi(szPololuInterfacePath+1) > 0))
	{
		PololuInterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szPololuInterfacePath+1, handlepololuinterfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the PololuInterface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*50);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("PololuInterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectpololuinterface(&PololuInterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*50);
					bConnected = TRUE; 

					inithandlepololuinterface(&PololuInterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handlepololuinterface(&PololuInterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a PololuInterface lost.\n");
					bConnected = FALSE;
					disconnectpololuinterface(&PololuInterfacePseudoRS232Port);
					uSleep(1000*50);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectpololuinterface(&PololuInterfacePseudoRS232Port);
	}

	//fclose(pololuinterfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}